

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

size_t __thiscall capnp::_::ReaderArena::sizeInWords(ReaderArena *this)

{
  SegmentReader *pSVar1;
  size_t sVar2;
  uint i;
  SegmentId id;
  
  sVar2 = (this->segment0).ptr.size_;
  id.value = 1;
  while( true ) {
    pSVar1 = tryGetSegment(this,id);
    if (pSVar1 == (SegmentReader *)0x0) break;
    sVar2 = sVar2 + (uint)(pSVar1->ptr).size_;
    id.value = id.value + 1;
  }
  return sVar2;
}

Assistant:

size_t ReaderArena::sizeInWords() {
  size_t total = segment0.getArray().size();

  for (uint i = 1; ; i++) {
    SegmentReader* segment = tryGetSegment(SegmentId(i));
    if (segment == nullptr) return total;
    total += unboundAs<size_t>(segment->getSize() / WORDS);
  }
}